

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O3

void zzMod(word *r,word *a,size_t n,word *b,size_t m,void *stack)

{
  word *a_00;
  long *plVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  word wVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  int iVar13;
  word wVar14;
  size_t shift;
  ulong uVar15;
  long lVar16;
  size_t sVar17;
  size_t sVar18;
  word *b_00;
  word *b_01;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  
  iVar13 = wwCmp2(a,n,b,m);
  if (iVar13 < 0) {
    stack = a;
    if (n <= m && m - n != 0) {
      wwSetZero(r + n,m - n);
      m = n;
    }
  }
  else {
    if (m == 1) {
      if (n == 0) {
        wVar14 = 0;
      }
      else {
        wVar5 = *b;
        wVar14 = 0;
        do {
          lVar12 = n - 1;
          n = n - 1;
          wVar14 = __umodti3(a[lVar12],wVar14,wVar5,0);
        } while (n != 0);
      }
      *r = wVar14;
      return;
    }
    puVar2 = (undefined8 *)((long)stack + n * 8);
    b_00 = puVar2 + 1;
    wwCopy((word *)stack,a,n);
    *puVar2 = 0;
    wwCopy(b_00,b,m);
    shift = u64CLZ(b[m - 1]);
    wwShHi((word *)stack,n + 1,shift);
    wwShHi(b_00,m,shift);
    if (m <= n) {
      lVar12 = m * 8 + n * 8;
      b_01 = (word *)((long)stack + lVar12 + 8);
      a_00 = (word *)((long)stack + lVar12 + -8);
      lVar21 = n * 8 + m * -8 + (long)stack;
      sVar18 = n;
      do {
        puVar3 = (ulong *)((long)stack + sVar18 * 8);
        uVar20 = 0xffffffffffffffff;
        if (*puVar3 != *(ulong *)((long)stack + m * 8 + n * 8)) {
          uVar20 = __udivti3(puVar3[-1]);
        }
        wwCopy(b_01,a_00,2);
        lVar16 = 0;
        uVar19 = 0;
        do {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = uVar19;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar20;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = b_01[lVar16];
          auVar10 = auVar6 * auVar8 + auVar10;
          uVar19 = auVar10._8_8_;
          b_01[lVar16] = auVar10._0_8_;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 2);
        *(ulong *)((long)stack + lVar12 + 0x18) = uVar19;
        while (iVar13 = wwCmp2(b_01,3,puVar3 + -2,3), 0 < iVar13) {
          uVar20 = uVar20 - 1;
          wVar14 = zzSub2(b_01,a_00,2);
          plVar1 = (long *)((long)stack + lVar12 + 0x18);
          *plVar1 = *plVar1 - wVar14;
        }
        if (m == 0) {
          uVar19 = 0;
        }
        else {
          sVar17 = 0;
          uVar19 = 0;
          do {
            auVar11._8_8_ = 0;
            auVar11._0_8_ = uVar19;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = uVar20;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = b_00[sVar17];
            auVar11 = auVar7 * auVar9 + auVar11;
            uVar15 = auVar11._0_8_;
            puVar4 = (ulong *)(lVar21 + sVar17 * 8);
            uVar19 = *puVar4;
            *puVar4 = *puVar4 - uVar15;
            uVar19 = auVar11._8_8_ + (ulong)(uVar19 < uVar15);
            sVar17 = sVar17 + 1;
          } while (m != sVar17);
        }
        uVar20 = *puVar3;
        *puVar3 = uVar20 - uVar19;
        if (CARRY8(uVar20 - uVar19,uVar19)) {
          wVar14 = zzAdd2(puVar3 + -m,b_00,m);
          *puVar3 = *puVar3 + wVar14;
        }
        sVar18 = sVar18 - 1;
        lVar21 = lVar21 + -8;
      } while (m <= sVar18);
    }
    wwShLo((word *)stack,n + 1,shift);
  }
  wwCopy(r,(word *)stack,m);
  return;
}

Assistant:

void zzMod(word r[], const word a[], size_t n, const word b[], size_t m, void* stack)
{
	register dword qhat;
	register size_t shift;
	register word t;
	size_t i;
	// переменные в stack
	word* divident;		/*< нормализованное делимое (n + 1 слово) */
	word* divisor;		/*< нормализованный делитель (m слов) */
	word* mul;			/*< вспомогательное произведение (3 слова) */
	// pre
	ASSERT(wwIsValid(a, n) && wwIsValid(b, m));
	ASSERT(m > 0 && b[m - 1] > 0);
	ASSERT(a == r || wwIsDisjoint2(a, n, r, m));
	// a < b?
	if (wwCmp2(a, n, b, m) < 0)
	{
		// r <- a
		if (n < m)
			wwSetZero(r + n, m - n), m = n;
		wwCopy(r, a, m);
		return;
	}
	// делим на одноразрядное число?
	if (m == 1)
	{
		r[0] = zzModW(a, n, b[0]);
		return;
	}
	// резервируем переменные в stack
	divident = (word*)stack;
	divisor = divident + n + 1;
	mul = divisor + m;
	stack = mul + 3;
	// divident <- a
	wwCopy(divident, a, n);
	divident[n] = 0;
	// divisor <- b
	wwCopy(divisor, b, m);
	// нормализация
	shift = wordCLZ(b[m - 1]);
	wwShHi(divident, n + 1, shift);
	wwShHi(divisor, m, shift);
	// цикл по разрядам делимого
	for (i = n; i >= m; --i)
	{
		// вычислить пробное частное
		if (divident[i] == divisor[m - 1])
			t = WORD_MAX;
		else
		{
			qhat = divident[i];
			qhat <<= B_PER_W;
			qhat |= divident[i - 1];
			qhat /= divisor[m - 1];
			t = (word)qhat;
		}
		// уточнить пробное частное
		wwCopy(mul, divisor + m - 2, 2);
		mul[2] = zzMulW(mul, mul, 2, t);
		while (wwCmp2(mul, 3, divident + i - 2, 3) > 0)
		{
			t--;
			mul[2] -= zzSub2(mul, divisor + m - 2, 2);
		}
		// учесть пробное частное
		t = zzSubMulW(divident + i - m, divisor, m, t);
		divident[i] -= t;
		if (divident[i] > (word)~t)
			// корректирующее сложение
			divident[i] += zzAdd2(divident + i - m, divisor, m);
	}
	// денормализация
	wwShLo(divident, n + 1, shift);
	// сохранить остаток
	wwCopy(r, divident, m);
	// очистить регистровые переменные
	t = 0, shift = 0, qhat = 0;
}